

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::trim(string *str)

{
  char *in_RSI;
  string *in_RDI;
  size_type end;
  size_type start;
  allocator local_21;
  undefined8 local_20;
  long local_18;
  char *local_10;
  
  local_10 = in_RSI;
  local_18 = std::__cxx11::string::find_first_not_of(in_RSI,0x1f7207);
  local_20 = std::__cxx11::string::find_last_not_of(local_10,0x1f7207);
  if (local_18 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    std::__cxx11::string::substr((ulong)in_RDI,(ulong)local_10);
  }
  return in_RDI;
}

Assistant:

inline std::string trim( std::string const& str ) {
        std::string::size_type start = str.find_first_not_of( "\n\r\t " );
        std::string::size_type end = str.find_last_not_of( "\n\r\t " );

        return start != std::string::npos ? str.substr( start, 1+end-start ) : "";
    }